

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,std::mutex>>
               (parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_std::mutex>
                *value,ostream *os)

{
  ostream *os_local;
  parallel_flat_hash_map<int,_int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  *value_local;
  
  ContainerPrinter::
  PrintValue<phmap::parallel_flat_hash_map<int,int,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,int>>,4ul,std::mutex>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      ProtobufPrinter,
#ifdef GTEST_HAS_ABSL
      ConvertibleToAbslStringifyPrinter,
#endif  // GTEST_HAS_ABSL
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ConvertibleToIntegerPrinter, ConvertibleToStringViewPrinter,
      RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}